

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawIndexedTest.cpp
# Opt level: O3

void __thiscall
vkt::Draw::anon_unknown_10::DrawIndexed::DrawIndexed
          (DrawIndexed *this,Context *context,TestSpec *testSpec)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_> *this_01;
  VkPrimitiveTopology VVar1;
  char *vertexShaderName;
  DrawIndexed *this_02;
  mapped_type *ppcVar2;
  uint *puVar3;
  iterator iVar4;
  int iVar5;
  RGBA local_10c;
  VertexElementData local_108;
  DrawIndexed *local_e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_d8;
  float local_d0 [2];
  float afStack_c8 [2];
  float local_c0 [2];
  float afStack_b8 [2];
  float local_b0 [2];
  float afStack_a8 [2];
  float local_a0 [2];
  float afStack_98 [2];
  float local_90 [2];
  float afStack_88 [2];
  float local_80 [2];
  float afStack_78 [2];
  float local_70 [2];
  float afStack_68 [2];
  float local_60 [2];
  float afStack_58 [2];
  float local_50 [2];
  float afStack_48 [2];
  float local_40 [2];
  float afStack_38 [2];
  
  local_108.super_PositionColorVertex.position.m_data._0_8_ =
       local_108.super_PositionColorVertex.position.m_data._0_8_ & 0xffffffff00000000;
  ppcVar2 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[](&testSpec->shaders,(key_type *)&local_108);
  vertexShaderName = *ppcVar2;
  local_10c.m_value = 1;
  ppcVar2 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[](&testSpec->shaders,&local_10c.m_value);
  DrawTestsBaseClass::DrawTestsBaseClass
            (&this->super_DrawTestsBaseClass,context,vertexShaderName,*ppcVar2,testSpec->topology);
  (this->super_DrawTestsBaseClass).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__DrawIndexed_00d31b90;
  this_00 = &this->m_indexes;
  (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_indexBuffer).m_ptr = (Buffer *)0x0;
  (this->m_indexBuffer).m_state = (SharedPtrStateBase *)0x0;
  VVar1 = (this->super_DrawTestsBaseClass).m_topology;
  local_e0 = this;
  local_d8 = this_00;
  if (VVar1 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP) {
    local_108.super_PositionColorVertex.position.m_data._0_8_ =
         (ulong)(uint)local_108.super_PositionColorVertex.position.m_data[1] << 0x20;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (this_00,(iterator)0x0,(uint *)&local_108);
    iVar4._M_current =
         (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar3 = (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_108.super_PositionColorVertex.position.m_data._0_8_ =
         local_108.super_PositionColorVertex.position.m_data._0_8_ & 0xffffffff00000000;
    if (iVar4._M_current == puVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar4,(uint *)&local_108);
      iVar4._M_current =
           (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_finish;
      puVar3 = (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 0;
      iVar4._M_current = iVar4._M_current + 1;
      (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_108.super_PositionColorVertex.position.m_data[0] = 2.8026e-45;
    if (iVar4._M_current == puVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar4,(uint *)&local_108);
      iVar4._M_current =
           (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_finish;
      puVar3 = (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 2;
      iVar4._M_current = iVar4._M_current + 1;
      (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_108.super_PositionColorVertex.position.m_data[0] = 0.0;
    if (iVar4._M_current == puVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar4,(uint *)&local_108);
      iVar4._M_current =
           (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_finish;
      puVar3 = (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 0;
      iVar4._M_current = iVar4._M_current + 1;
      (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_108.super_PositionColorVertex.position.m_data[0] = 8.40779e-45;
    if (iVar4._M_current == puVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar4,(uint *)&local_108);
      iVar4._M_current =
           (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_finish;
      puVar3 = (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 6;
      iVar4._M_current = iVar4._M_current + 1;
      (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_108.super_PositionColorVertex.position.m_data[0] = 7.00649e-45;
    if (iVar4._M_current == puVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar4,(uint *)&local_108);
      iVar4._M_current =
           (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_finish;
      puVar3 = (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 5;
      iVar4._M_current = iVar4._M_current + 1;
      (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_108.super_PositionColorVertex.position.m_data[0] = 0.0;
    if (iVar4._M_current == puVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar4,(uint *)&local_108);
      iVar4._M_current =
           (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_finish;
      puVar3 = (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 0;
      iVar4._M_current = iVar4._M_current + 1;
      (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_108.super_PositionColorVertex.position.m_data[0] = 9.80909e-45;
    if (iVar4._M_current == puVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar4,(uint *)&local_108);
      goto LAB_006e7857;
    }
  }
  else {
    if (VVar1 != VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) goto LAB_006e7857;
    local_108.super_PositionColorVertex.position.m_data._0_8_ =
         (ulong)(uint)local_108.super_PositionColorVertex.position.m_data[1] << 0x20;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (this_00,(iterator)0x0,(uint *)&local_108);
    iVar4._M_current =
         (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar3 = (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_108.super_PositionColorVertex.position.m_data._0_8_ =
         local_108.super_PositionColorVertex.position.m_data._0_8_ & 0xffffffff00000000;
    if (iVar4._M_current == puVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar4,(uint *)&local_108);
      iVar4._M_current =
           (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_finish;
      puVar3 = (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 0;
      iVar4._M_current = iVar4._M_current + 1;
      (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_108.super_PositionColorVertex.position.m_data[0] = 2.8026e-45;
    if (iVar4._M_current == puVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar4,(uint *)&local_108);
      iVar4._M_current =
           (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_finish;
      puVar3 = (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 2;
      iVar4._M_current = iVar4._M_current + 1;
      (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_108.super_PositionColorVertex.position.m_data[0] = 0.0;
    if (iVar4._M_current == puVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar4,(uint *)&local_108);
      iVar4._M_current =
           (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_finish;
      puVar3 = (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 0;
      iVar4._M_current = iVar4._M_current + 1;
      (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_108.super_PositionColorVertex.position.m_data[0] = 8.40779e-45;
    if (iVar4._M_current == puVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar4,(uint *)&local_108);
      iVar4._M_current =
           (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_finish;
      puVar3 = (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 6;
      iVar4._M_current = iVar4._M_current + 1;
      (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_108.super_PositionColorVertex.position.m_data[0] = 8.40779e-45;
    if (iVar4._M_current == puVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar4,(uint *)&local_108);
      iVar4._M_current =
           (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_finish;
      puVar3 = (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 6;
      iVar4._M_current = iVar4._M_current + 1;
      (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_108.super_PositionColorVertex.position.m_data[0] = 0.0;
    if (iVar4._M_current == puVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar4,(uint *)&local_108);
      iVar4._M_current =
           (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_finish;
      puVar3 = (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 0;
      iVar4._M_current = iVar4._M_current + 1;
      (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_108.super_PositionColorVertex.position.m_data[0] = 9.80909e-45;
    if (iVar4._M_current == puVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar4,(uint *)&local_108);
      goto LAB_006e7857;
    }
  }
  *iVar4._M_current = 7;
  (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = iVar4._M_current + 1;
LAB_006e7857:
  this_01 = &(this->super_DrawTestsBaseClass).m_data;
  iVar5 = 0xd;
  do {
    local_10c.m_value = 0xffff0000;
    tcu::RGBA::toVec(&local_10c);
    local_108.super_PositionColorVertex.color.m_data[0] = local_40[0];
    local_108.super_PositionColorVertex.color.m_data[1] = local_40[1];
    local_108.super_PositionColorVertex.color.m_data[2] = afStack_38[0];
    local_108.super_PositionColorVertex.color.m_data[3] = afStack_38[1];
    local_108.super_PositionColorVertex.position.m_data[0] = -1.0;
    local_108.super_PositionColorVertex.position.m_data[1] = 1.0;
    local_108.super_PositionColorVertex.position.m_data[2] = 1.0;
    local_108.super_PositionColorVertex.position.m_data[3] = 1.0;
    local_108.refVertexIndex = 0xffffffff;
    std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
    emplace_back<vkt::Draw::VertexElementData>(this_01,&local_108);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  local_10c.m_value = 0xffff0000;
  tcu::RGBA::toVec(&local_10c);
  local_108.super_PositionColorVertex.color.m_data[0] = local_50[0];
  local_108.super_PositionColorVertex.color.m_data[1] = local_50[1];
  local_108.super_PositionColorVertex.color.m_data[2] = afStack_48[0];
  local_108.super_PositionColorVertex.color.m_data[3] = afStack_48[1];
  local_108.super_PositionColorVertex.position.m_data[0] = -0.3;
  local_108.super_PositionColorVertex.position.m_data[1] = 0.3;
  local_108.super_PositionColorVertex.position.m_data[2] = 1.0;
  local_108.super_PositionColorVertex.position.m_data[3] = 1.0;
  local_108.refVertexIndex = 0xd;
  std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
  emplace_back<vkt::Draw::VertexElementData>(this_01,&local_108);
  this_02 = local_e0;
  local_10c.m_value = 0xffff0000;
  tcu::RGBA::toVec(&local_10c);
  local_108.super_PositionColorVertex.color.m_data[0] = local_60[0];
  local_108.super_PositionColorVertex.color.m_data[1] = local_60[1];
  local_108.super_PositionColorVertex.color.m_data[2] = afStack_58[0];
  local_108.super_PositionColorVertex.color.m_data[3] = afStack_58[1];
  local_108.super_PositionColorVertex.position.m_data[0] = -1.0;
  local_108.super_PositionColorVertex.position.m_data[1] = 1.0;
  local_108.super_PositionColorVertex.position.m_data[2] = 1.0;
  local_108.super_PositionColorVertex.position.m_data[3] = 1.0;
  local_108.refVertexIndex = 0xe;
  std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
  emplace_back<vkt::Draw::VertexElementData>(this_01,&local_108);
  local_10c.m_value = 0xffff0000;
  tcu::RGBA::toVec(&local_10c);
  local_108.super_PositionColorVertex.color.m_data[0] = local_70[0];
  local_108.super_PositionColorVertex.color.m_data[1] = local_70[1];
  local_108.super_PositionColorVertex.color.m_data[2] = afStack_68[0];
  local_108.super_PositionColorVertex.color.m_data[3] = afStack_68[1];
  local_108.super_PositionColorVertex.position.m_data[0] = -0.3;
  local_108.super_PositionColorVertex.position.m_data[1] = -0.3;
  local_108.super_PositionColorVertex.position.m_data[2] = 1.0;
  local_108.super_PositionColorVertex.position.m_data[3] = 1.0;
  local_108.refVertexIndex = 0xf;
  std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
  emplace_back<vkt::Draw::VertexElementData>(this_01,&local_108);
  local_10c.m_value = 0xffff0000;
  tcu::RGBA::toVec(&local_10c);
  local_108.super_PositionColorVertex.color.m_data[0] = local_80[0];
  local_108.super_PositionColorVertex.color.m_data[1] = local_80[1];
  local_108.super_PositionColorVertex.color.m_data[2] = afStack_78[0];
  local_108.super_PositionColorVertex.color.m_data[3] = afStack_78[1];
  local_108.super_PositionColorVertex.position.m_data[0] = 1.0;
  local_108.super_PositionColorVertex.position.m_data[1] = -1.0;
  local_108.super_PositionColorVertex.position.m_data[2] = 1.0;
  local_108.super_PositionColorVertex.position.m_data[3] = 1.0;
  local_108.refVertexIndex = 0x10;
  std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
  emplace_back<vkt::Draw::VertexElementData>(this_01,&local_108);
  local_10c.m_value = 0xffff0000;
  tcu::RGBA::toVec(&local_10c);
  local_108.super_PositionColorVertex.color.m_data[0] = local_90[0];
  local_108.super_PositionColorVertex.color.m_data[1] = local_90[1];
  local_108.super_PositionColorVertex.color.m_data[2] = afStack_88[0];
  local_108.super_PositionColorVertex.color.m_data[3] = afStack_88[1];
  local_108.super_PositionColorVertex.position.m_data[0] = -0.3;
  local_108.super_PositionColorVertex.position.m_data[1] = -0.3;
  local_108.super_PositionColorVertex.position.m_data[2] = 1.0;
  local_108.super_PositionColorVertex.position.m_data[3] = 1.0;
  local_108.refVertexIndex = 0x11;
  std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
  emplace_back<vkt::Draw::VertexElementData>(this_01,&local_108);
  local_10c.m_value = 0xffff0000;
  tcu::RGBA::toVec(&local_10c);
  local_108.super_PositionColorVertex.color.m_data[0] = local_a0[0];
  local_108.super_PositionColorVertex.color.m_data[1] = local_a0[1];
  local_108.super_PositionColorVertex.color.m_data[2] = afStack_98[0];
  local_108.super_PositionColorVertex.color.m_data[3] = afStack_98[1];
  local_108.super_PositionColorVertex.position.m_data[0] = 0.3;
  local_108.super_PositionColorVertex.position.m_data[1] = 0.3;
  local_108.super_PositionColorVertex.position.m_data[2] = 1.0;
  local_108.super_PositionColorVertex.position.m_data[3] = 1.0;
  local_108.refVertexIndex = 0x12;
  std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
  emplace_back<vkt::Draw::VertexElementData>(this_01,&local_108);
  local_10c.m_value = 0xffff0000;
  tcu::RGBA::toVec(&local_10c);
  local_108.super_PositionColorVertex.color.m_data[0] = local_b0[0];
  local_108.super_PositionColorVertex.color.m_data[1] = local_b0[1];
  local_108.super_PositionColorVertex.color.m_data[2] = afStack_a8[0];
  local_108.super_PositionColorVertex.color.m_data[3] = afStack_a8[1];
  local_108.super_PositionColorVertex.position.m_data[0] = 0.3;
  local_108.super_PositionColorVertex.position.m_data[1] = -0.3;
  local_108.super_PositionColorVertex.position.m_data[2] = 1.0;
  local_108.super_PositionColorVertex.position.m_data[3] = 1.0;
  local_108.refVertexIndex = 0x13;
  std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
  emplace_back<vkt::Draw::VertexElementData>(this_01,&local_108);
  local_10c.m_value = 0xffff0000;
  tcu::RGBA::toVec(&local_10c);
  local_108.super_PositionColorVertex.color.m_data[0] = local_c0[0];
  local_108.super_PositionColorVertex.color.m_data[1] = local_c0[1];
  local_108.super_PositionColorVertex.color.m_data[2] = afStack_b8[0];
  local_108.super_PositionColorVertex.color.m_data[3] = afStack_b8[1];
  local_108.super_PositionColorVertex.position.m_data[0] = 0.3;
  local_108.super_PositionColorVertex.position.m_data[1] = 0.3;
  local_108.super_PositionColorVertex.position.m_data[2] = 1.0;
  local_108.super_PositionColorVertex.position.m_data[3] = 1.0;
  local_108.refVertexIndex = 0x14;
  std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
  emplace_back<vkt::Draw::VertexElementData>(this_01,&local_108);
  local_10c.m_value = 0xffff0000;
  tcu::RGBA::toVec(&local_10c);
  local_108.super_PositionColorVertex.color.m_data[0] = local_d0[0];
  local_108.super_PositionColorVertex.color.m_data[1] = local_d0[1];
  local_108.super_PositionColorVertex.color.m_data[2] = afStack_c8[0];
  local_108.super_PositionColorVertex.color.m_data[3] = afStack_c8[1];
  local_108.super_PositionColorVertex.position.m_data[0] = -1.0;
  local_108.super_PositionColorVertex.position.m_data[1] = 1.0;
  local_108.super_PositionColorVertex.position.m_data[2] = 1.0;
  local_108.super_PositionColorVertex.position.m_data[3] = 1.0;
  local_108.refVertexIndex = 0xffffffff;
  std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
  emplace_back<vkt::Draw::VertexElementData>(this_01,&local_108);
  DrawTestsBaseClass::initialize(&this_02->super_DrawTestsBaseClass);
  return;
}

Assistant:

DrawIndexed::DrawIndexed (Context &context, TestSpec testSpec)
	: DrawTestsBaseClass(context, testSpec.shaders[glu::SHADERTYPE_VERTEX], testSpec.shaders[glu::SHADERTYPE_FRAGMENT], testSpec.topology)
{
	switch (m_topology)
	{
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
			m_indexes.push_back(0);
			m_indexes.push_back(0);
			m_indexes.push_back(2);
			m_indexes.push_back(0);
			m_indexes.push_back(6);
			m_indexes.push_back(6);
			m_indexes.push_back(0);
			m_indexes.push_back(7);
			break;
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
			m_indexes.push_back(0);
			m_indexes.push_back(0);
			m_indexes.push_back(2);
			m_indexes.push_back(0);
			m_indexes.push_back(6);
			m_indexes.push_back(5);
			m_indexes.push_back(0);
			m_indexes.push_back(7);
			break;

		case vk::VK_PRIMITIVE_TOPOLOGY_POINT_LIST:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_LIST:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_PATCH_LIST:
		case vk::VK_PRIMITIVE_TOPOLOGY_LAST:
			DE_FATAL("Topology not implemented");
			break;
		default:
			DE_FATAL("Unknown topology");
			break;
	}

	for (int unusedIdx = 0; unusedIdx < VERTEX_OFFSET; unusedIdx++)
	{
		m_data.push_back(VertexElementData(tcu::Vec4(-1.0f, 1.0f, 1.0f, 1.0f), tcu::RGBA::blue().toVec(), -1));
	}

	int vertexIndex = VERTEX_OFFSET;

	m_data.push_back(VertexElementData(tcu::Vec4(	-0.3f,	 0.3f,	1.0f,	1.0f), tcu::RGBA::blue().toVec(), vertexIndex++));
	m_data.push_back(VertexElementData(tcu::Vec4(	-1.0f,	 1.0f,	1.0f,	1.0f), tcu::RGBA::blue().toVec(), vertexIndex++));
	m_data.push_back(VertexElementData(tcu::Vec4(	-0.3f,	-0.3f,	1.0f,	1.0f), tcu::RGBA::blue().toVec(), vertexIndex++));
	m_data.push_back(VertexElementData(tcu::Vec4(	 1.0f,	-1.0f,	1.0f,	1.0f), tcu::RGBA::blue().toVec(), vertexIndex++));
	m_data.push_back(VertexElementData(tcu::Vec4(	-0.3f,	-0.3f,	1.0f,	1.0f), tcu::RGBA::blue().toVec(), vertexIndex++));
	m_data.push_back(VertexElementData(tcu::Vec4(	 0.3f,	 0.3f,	1.0f,	1.0f), tcu::RGBA::blue().toVec(), vertexIndex++));
	m_data.push_back(VertexElementData(tcu::Vec4(	 0.3f,	-0.3f,	1.0f,	1.0f), tcu::RGBA::blue().toVec(), vertexIndex++));
	m_data.push_back(VertexElementData(tcu::Vec4(	 0.3f,	 0.3f,	1.0f,	1.0f), tcu::RGBA::blue().toVec(), vertexIndex++));

	m_data.push_back(VertexElementData(tcu::Vec4(	-1.0f,	 1.0f,	1.0f,	1.0f), tcu::RGBA::blue().toVec(), -1));

	initialize();
}